

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

string * QPDFJob::json_out_schema_v1_abi_cxx11_(void)

{
  string *in_RDI;
  JSON local_20;
  
  json_schema((QPDFJob *)&local_20,1,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0);
  JSON::unparse_abi_cxx11_(in_RDI,&local_20);
  JSON::~JSON(&local_20);
  return in_RDI;
}

Assistant:

std::string
QPDFJob::json_out_schema_v1()
{
    return json_schema(1).unparse();
}